

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mddglobals.cpp
# Opt level: O0

void mdd_table(vec<IntVar_*> *x,vec<vec<int>_> *t,MDDOpts *mopts)

{
  uint uVar1;
  vec<IntVar_*> *in_RDI;
  MDDNodeInt m;
  MDDTable tab;
  uint i;
  int maxdom;
  vec<int> doms;
  int in_stack_fffffffffffffed4;
  IntVar **in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  int in_stack_ffffffffffffff2c;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  vec<vec<int>_> *in_stack_ffffffffffffff38;
  vec<int> *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff4c;
  MDDTable *in_stack_ffffffffffffff50;
  MDDOpts *in_stack_ffffffffffffffa8;
  MDDNodeInt in_stack_ffffffffffffffb4;
  MDDTable *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_30;
  int local_2c;
  vec<int> local_28 [2];
  vec<IntVar_*> *local_8;
  
  local_8 = in_RDI;
  vec<int>::vec(local_28);
  local_2c = 0;
  local_30 = 0;
  while( true ) {
    uVar1 = vec<IntVar_*>::size(local_8);
    if (uVar1 <= local_30) break;
    vec<IntVar_*>::operator[](local_8,local_30);
    in_stack_ffffffffffffffc0 = IntVar::getMax((IntVar *)0x18d8e8);
    in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + 1;
    vec<int>::push((vec<int> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (int *)in_stack_fffffffffffffed8);
    vec<IntVar_*>::operator[](local_8,local_30);
    in_stack_fffffffffffffee4 = IntVar::getMax((IntVar *)0x18d93a);
    if (local_2c < in_stack_fffffffffffffee4 + 1) {
      in_stack_fffffffffffffed8 = vec<IntVar_*>::operator[](local_8,local_30);
      in_stack_fffffffffffffed4 = IntVar::getMax((IntVar *)0x18d978);
      local_2c = in_stack_fffffffffffffed4 + 1;
    }
    local_30 = local_30 + 1;
  }
  uVar1 = vec<IntVar_*>::size(local_8);
  MDDTable::MDDTable((MDDTable *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                     in_stack_ffffffffffffff2c);
  vec<IntVar_*>::size(local_8);
  mdd_table(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,
            in_stack_ffffffffffffff38,(bool)in_stack_ffffffffffffff37);
  addMDDProp((vec<IntVar_*> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  MDDTable::~MDDTable((MDDTable *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffed4,uVar1));
  return;
}

Assistant:

void mdd_table(vec<IntVar*>& x, vec<vec<int> >& t, const MDDOpts& mopts) {
	vec<int> doms;

	int maxdom = 0;
	for (unsigned int i = 0; i < x.size(); i++) {
		// assert(x[i]->getMin() == 0);
		doms.push(x[i]->getMax() + 1);

		// Could also generate maxdom from tuples.
		if ((x[i]->getMax() + 1) > maxdom) {
			maxdom = x[i]->getMax() + 1;
		}
	}
	MDDTable tab(x.size());

	// Assumes a positive table.
	const MDDNodeInt m(mdd_table(tab, x.size(), doms, t, true));

	//   tab.print_mdd_tikz(m);

	addMDDProp(x, tab, m, mopts);
}